

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnTryExpr(BinaryReaderIR *this,Type sig_type)

{
  Result RVar1;
  pointer *__ptr;
  Expr *local_38;
  _Head_base<0UL,_wabt::Expr_*,_false> local_30;
  
  std::make_unique<wabt::TryExpr>();
  SetBlockDeclaration(this,(BlockDeclaration *)&local_38[1].loc.filename._M_str,sig_type);
  local_30._M_head_impl = local_38;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_30);
  if (local_30._M_head_impl != (Expr *)0x0) {
    (*(local_30._M_head_impl)->_vptr_Expr[1])();
  }
  if (RVar1.enum_ != Error) {
    PushLabel(this,Try,(ExprList *)&local_38[5].super_intrusive_list_base<wabt::Expr>.prev_,local_38
             );
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderIR::OnTryExpr(Type sig_type) {
  auto expr_ptr = std::make_unique<TryExpr>();
  // Save expr so it can be used below, after expr_ptr has been moved.
  TryExpr* expr = expr_ptr.get();
  ExprList* expr_list = &expr->block.exprs;
  SetBlockDeclaration(&expr->block.decl, sig_type);
  CHECK_RESULT(AppendExpr(std::move(expr_ptr)));
  PushLabel(LabelType::Try, expr_list, expr);
  return Result::Ok;
}